

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::GetDependence
          (LoopDependenceAnalysis *this,Instruction *source,Instruction *destination,
          DistanceVector *distance_vector)

{
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *__t;
  ScalarEvolutionAnalysis *pSVar1;
  Op OVar2;
  pointer pDVar3;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var4;
  pointer ppVar5;
  bool bVar6;
  int iVar7;
  DistanceEntry *entry;
  Instruction *pIVar8;
  Instruction *pIVar9;
  pointer pDVar10;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var11;
  SENode *pSVar12;
  SENode *pSVar13;
  Loop *loop;
  DistanceEntry *pDVar14;
  _Base_ptr p_Var15;
  _Rb_tree_node_base *p_Var16;
  ulong uVar17;
  undefined8 uVar18;
  LoopDependenceAnalysis *this_00;
  _Alloc_hider _Var19;
  Instruction *pIVar20;
  vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> *__range4;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *ppVar21;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var22;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *this_01;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  current_loops;
  PartitionedSubscripts sets_of_subscripts;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  destination_subscripts;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  source_subscripts;
  vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
  local_238;
  undefined1 local_218 [8];
  _Rb_tree_node_base _Stack_210;
  _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  local_1e8;
  PartitionedSubscripts local_1b8;
  undefined1 local_1a0 [32];
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_100;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  MarkUnsusedDistanceEntriesAsIrrelevant(this,source,destination,distance_vector);
  pIVar8 = GetOperandDefinition(this,source,0);
  pIVar9 = GetOperandDefinition(this,destination,0);
  OVar2 = pIVar8->opcode_;
  if (pIVar9->opcode_ != OpAccessChain && OVar2 != OpAccessChain) {
    if (pIVar8 == pIVar9) {
      pDVar3 = (distance_vector->entries).
               super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pDVar10 = (distance_vector->entries).
                     super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start; pDVar10 != pDVar3;
          pDVar10 = pDVar10 + 1) {
        pDVar10->dependence_information = UNKNOWN;
        pDVar10->direction = ALL;
        pDVar10->distance = 0;
        pDVar10->peel_first = false;
        pDVar10->peel_last = false;
        *(ulong *)&pDVar10->field_0x12 = (ulong)(uint6)local_1e8._M_impl._0_6_;
        *(undefined8 *)((long)&pDVar10->point_x + 2) = 0;
        pDVar10->point_y = 0;
      }
      return false;
    }
    return true;
  }
  if ((OVar2 == OpAccessChain) != (pIVar9->opcode_ == OpAccessChain)) {
    pIVar20 = pIVar8;
    if (OVar2 == OpAccessChain) {
      pIVar20 = pIVar9;
      pIVar9 = pIVar8;
    }
    pIVar9 = GetOperandDefinition(this,pIVar9,0);
    if (pIVar20 == pIVar9) {
      pDVar3 = (distance_vector->entries).
               super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pDVar10 = (distance_vector->entries).
                     super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start; pDVar10 != pDVar3;
          pDVar10 = pDVar10 + 1) {
        pDVar10->dependence_information = UNKNOWN;
        pDVar10->direction = ALL;
        pDVar10->distance = 0;
        pDVar10->peel_first = false;
        pDVar10->peel_last = false;
        *(ulong *)&pDVar10->field_0x12 = (ulong)(uint6)local_1e8._M_impl._0_6_;
        *(undefined8 *)((long)&pDVar10->point_x + 2) = 0;
        pDVar10->point_y = 0;
      }
      return false;
    }
    return true;
  }
  pIVar8 = GetOperandDefinition(this,pIVar8,0);
  pIVar9 = GetOperandDefinition(this,pIVar9,0);
  if ((pIVar8->opcode_ == OpAccessChain) || (pIVar9->opcode_ == OpAccessChain)) {
    pDVar3 = (distance_vector->entries).
             super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar10 = (distance_vector->entries).
                   super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start; pDVar10 != pDVar3;
        pDVar10 = pDVar10 + 1) {
      pDVar10->dependence_information = UNKNOWN;
      pDVar10->direction = ALL;
      pDVar10->distance = 0;
      pDVar10->peel_first = false;
      pDVar10->peel_last = false;
      *(ulong *)&pDVar10->field_0x12 = (ulong)(uint6)local_1e8._M_impl._0_6_;
      *(undefined8 *)((long)&pDVar10->point_x + 2) = 0;
      pDVar10->point_y = 0;
    }
    return false;
  }
  if (pIVar8 != pIVar9) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Proved independence through different arrays.","");
    PrintDebug(this,&local_50);
    bVar6 = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return true;
    }
    uVar17 = local_50.field_2._M_allocated_capacity + 1;
    local_e8.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_50._M_dataplus._M_p;
    goto LAB_00606f29;
  }
  GetSubscripts(&local_e8,this,source);
  GetSubscripts(&local_100,this,destination);
  PartitionSubscripts(&local_1b8,this,&local_e8,&local_100);
  this_01 = &(local_1b8.
              super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  p_Var11 = &(local_1b8.
              super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  if (local_1b8.
      super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1b8.
      super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      while (p_Var22 = this_01 + 1, (this_01->_M_impl).super__Rb_tree_header._M_node_count != 1) {
        do {
          __t = p_Var11 + -1;
          if (__t == this_01) goto LAB_006068ab;
          p_Var4 = p_Var11 + -1;
          p_Var11 = __t;
        } while ((p_Var4->_M_impl).super__Rb_tree_header._M_node_count != 1);
        std::
        _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
        ::swap(this_01,__t);
        this_01 = p_Var22;
        if (__t == p_Var22) goto LAB_006068ab;
      }
      this_01 = p_Var22;
    } while (p_Var22 != p_Var11);
  }
LAB_006068ab:
  if (local_1b8.
      super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start < this_01) {
    pSVar1 = &this->scalar_evolution_;
    p_Var11 = &(local_1b8.
                super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_t;
    do {
      p_Var15 = (p_Var11->_M_impl).super__Rb_tree_header._M_header._M_left;
      pIVar9 = (Instruction *)p_Var15[1]._M_parent;
      pSVar12 = ScalarEvolutionAnalysis::AnalyzeInstruction(pSVar1,*(Instruction **)(p_Var15 + 1));
      pSVar12 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar12);
      pSVar13 = ScalarEvolutionAnalysis::AnalyzeInstruction(pSVar1,pIVar9);
      pSVar13 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar13);
      local_218 = (undefined1  [8])pSVar12;
      _Stack_210._0_8_ = pSVar13;
      loop = GetLoopForSubscriptPair
                       (this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_218);
      if ((loop == (Loop *)0x0) || (bVar6 = IsSupportedLoop(this,loop), bVar6)) {
        iVar7 = (**pSVar12->_vptr_SENode)(pSVar12);
        if ((iVar7 == 6) || (iVar7 = (**pSVar13->_vptr_SENode)(pSVar13), iVar7 == 6)) {
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,
                     "GetDependence found source_node || destination_node as CanNotCompute. Abandoning evaluation for this subscript."
                     ,"");
          PrintDebug(this,&local_140);
          uVar18 = local_140.field_2._M_allocated_capacity;
          _Var19._M_p = local_140._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) goto LAB_006069ed;
          goto LAB_006069f5;
        }
        bVar6 = IsZIV(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_218);
        if (!bVar6) {
LAB_00606ab3:
          bVar6 = IsSIV(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_218);
          if (bVar6) {
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_180,"Found a SIV subscript pair.","");
            PrintDebug(this,&local_180);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            bVar6 = SIVTest(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_218
                            ,distance_vector);
            if (bVar6) {
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,"Proved independence with SIVTest.","");
              PrintDebug(this,&local_90);
              _Var19._M_p = local_90._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_00606ed9;
              goto LAB_00606ee1;
            }
          }
          bVar6 = IsMIV(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_218);
          if (!bVar6) goto LAB_00606a12;
          local_1a0._0_8_ = local_1a0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a0,"Found a MIV subscript pair.","");
          PrintDebug(this,(string *)local_1a0);
          this_00 = (LoopDependenceAnalysis *)local_1a0._0_8_;
          if ((LoopDependenceAnalysis *)local_1a0._0_8_ !=
              (LoopDependenceAnalysis *)(local_1a0 + 0x10)) {
            operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
          }
          bVar6 = GCDMIVTest(this_00,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                                     local_218);
          if (!bVar6) goto LAB_00606a12;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"Proved independence with the GCD test.","");
          PrintDebug(this,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                        *)&local_1e8,this,pSVar12,pSVar13);
          for (; (_Rb_tree_header *)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left !=
                 &local_1e8._M_impl.super__Rb_tree_header;
              local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)
                   std::_Rb_tree_increment
                             (local_1e8._M_impl.super__Rb_tree_header._M_header._M_left)) {
            pDVar14 = GetDistanceEntryForLoop
                                (this,*(Loop **)(local_1e8._M_impl.super__Rb_tree_header._M_header.
                                                 _M_left + 1),distance_vector);
            pDVar14->direction = NONE;
          }
          std::
          _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
          ::_M_erase(&local_1e8,
                     (_Link_type)
                     CONCAT26(local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent._6_2_,
                              local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent._0_6_));
          goto LAB_00606ee1;
        }
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,"Found a ZIV subscript pair","");
        PrintDebug(this,&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        bVar6 = ZIVTest(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_218);
        if (!bVar6) goto LAB_00606ab3;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Proved independence with ZIVTest.","");
        PrintDebug(this,&local_70);
        local_90.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
        _Var19._M_p = local_70._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_00606ed9:
          operator_delete(_Var19._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00606ee1;
      }
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,
                 "GetDependence found an unsupported loop form. Assuming <=> for loop.","");
      PrintDebug(this,&local_120);
      uVar18 = local_120.field_2._M_allocated_capacity;
      _Var19._M_p = local_120._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
LAB_006069ed:
        operator_delete(_Var19._M_p,uVar18 + 1);
      }
LAB_006069f5:
      pDVar14 = GetDistanceEntryForSubscriptPair
                          (this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_218,
                           distance_vector);
      if (pDVar14 != (DistanceEntry *)0x0) {
        pDVar14->direction = ALL;
      }
LAB_00606a12:
      p_Var11 = p_Var11 + 1;
    } while (p_Var11 < this_01);
  }
  if (this_01 < local_1b8.
                super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pSVar1 = &this->scalar_evolution_;
    do {
      std::
      _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
      ::_Rb_tree((_Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                  *)&local_1e8,this_01);
      local_238.
      super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)0x0;
      local_238.
      super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)0x0;
      local_238.
      super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)0x0;
      p_Var15 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_1e8._M_impl.super__Rb_tree_header) {
        do {
          pIVar9 = (Instruction *)p_Var15[1]._M_parent;
          pSVar12 = ScalarEvolutionAnalysis::AnalyzeInstruction
                              (pSVar1,*(Instruction **)(p_Var15 + 1));
          pSVar12 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar12);
          pSVar13 = ScalarEvolutionAnalysis::AnalyzeInstruction(pSVar1,pIVar9);
          _Stack_210._0_8_ = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar13);
          local_218 = (undefined1  [8])pSVar12;
          if (local_238.
              super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_238.
              super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>,std::allocator<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>>>
            ::_M_realloc_insert<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>>
                      ((vector<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>,std::allocator<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>>>
                        *)&local_238,
                       (iterator)
                       local_238.
                       super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_218);
          }
          else {
            (local_238.
             super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = pSVar12;
            (local_238.
             super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = (SENode *)_Stack_210._0_8_;
            local_238.
            super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_238.
                 super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
          ppVar5 = local_238.
                   super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          ppVar21 = local_238.
                    super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while ((_Rb_tree_header *)p_Var15 != &local_1e8._M_impl.super__Rb_tree_header);
        for (; ppVar21 != ppVar5; ppVar21 = ppVar21 + 1) {
          CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                        *)local_218,this,ppVar21->first,ppVar21->second);
          p_Var16 = _Stack_210._M_left;
          while ((p_Var16 != &_Stack_210 &&
                 (bVar6 = IsSupportedLoop(this,*(Loop **)(p_Var16 + 1)), bVar6))) {
            p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
          }
          std::
          _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
          ::_M_erase((_Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                      *)local_218,(_Link_type)_Stack_210._M_parent);
        }
      }
      bVar6 = DeltaTest(this,&local_238,distance_vector);
      if (local_238.
          super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)0x0) {
        operator_delete(local_238.
                        super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_238.
                              super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.
                              super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
      ::_M_erase((_Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                  *)&local_1e8,
                 (_Link_type)
                 CONCAT26(local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent._6_2_,
                          local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent._0_6_));
      if (bVar6) goto LAB_00606ee1;
      this_01 = this_01 + 1;
    } while (this_01 < local_1b8.
                       super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "Couldn\'t prove independence.\nAll possible direction information has been collected in the input DistanceVector."
             ,"");
  PrintDebug(this,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  bVar6 = false;
LAB_00606ee3:
  std::
  vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
  ::~vector(&local_1b8);
  if (local_100.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.
         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    return bVar6;
  }
  uVar17 = (long)local_e8.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
           (long)local_e8.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
LAB_00606f29:
  operator_delete(local_e8.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,uVar17);
  return bVar6;
LAB_00606ee1:
  bVar6 = true;
  goto LAB_00606ee3;
}

Assistant:

bool LoopDependenceAnalysis::GetDependence(const Instruction* source,
                                           const Instruction* destination,
                                           DistanceVector* distance_vector) {
  // Start off by finding and marking all the loops in |loops_| that are
  // irrelevant to the dependence analysis.
  MarkUnsusedDistanceEntriesAsIrrelevant(source, destination, distance_vector);

  Instruction* source_access_chain = GetOperandDefinition(source, 0);
  Instruction* destination_access_chain = GetOperandDefinition(destination, 0);

  auto num_access_chains =
      (source_access_chain->opcode() == spv::Op::OpAccessChain) +
      (destination_access_chain->opcode() == spv::Op::OpAccessChain);

  // If neither is an access chain, then they are load/store to a variable.
  if (num_access_chains == 0) {
    if (source_access_chain != destination_access_chain) {
      // Not the same location, report independence
      return true;
    } else {
      // Accessing the same variable
      for (auto& entry : distance_vector->GetEntries()) {
        entry = DistanceEntry();
      }
      return false;
    }
  }

  // If only one is an access chain, it could be accessing a part of a struct
  if (num_access_chains == 1) {
    auto source_is_chain =
        source_access_chain->opcode() == spv::Op::OpAccessChain;
    auto access_chain =
        source_is_chain ? source_access_chain : destination_access_chain;
    auto variable =
        source_is_chain ? destination_access_chain : source_access_chain;

    auto location_in_chain = GetOperandDefinition(access_chain, 0);

    if (variable != location_in_chain) {
      // Not the same location, report independence
      return true;
    } else {
      // Accessing the same variable
      for (auto& entry : distance_vector->GetEntries()) {
        entry = DistanceEntry();
      }
      return false;
    }
  }

  // If the access chains aren't collecting from the same structure there is no
  // dependence.
  Instruction* source_array = GetOperandDefinition(source_access_chain, 0);
  Instruction* destination_array =
      GetOperandDefinition(destination_access_chain, 0);

  // Nested access chains are not supported yet, bail out.
  if (source_array->opcode() == spv::Op::OpAccessChain ||
      destination_array->opcode() == spv::Op::OpAccessChain) {
    for (auto& entry : distance_vector->GetEntries()) {
      entry = DistanceEntry();
    }
    return false;
  }

  if (source_array != destination_array) {
    PrintDebug("Proved independence through different arrays.");
    return true;
  }

  // To handle multiple subscripts we must get every operand in the access
  // chains past the first.
  std::vector<Instruction*> source_subscripts = GetSubscripts(source);
  std::vector<Instruction*> destination_subscripts = GetSubscripts(destination);

  auto sets_of_subscripts =
      PartitionSubscripts(source_subscripts, destination_subscripts);

  auto first_coupled = std::partition(
      std::begin(sets_of_subscripts), std::end(sets_of_subscripts),
      [](const std::set<std::pair<Instruction*, Instruction*>>& set) {
        return set.size() == 1;
      });

  // Go through each subscript testing for independence.
  // If any subscript results in independence, we prove independence between the
  // load and store.
  // If we can't prove independence we store what information we can gather in
  // a DistanceVector.
  for (auto it = std::begin(sets_of_subscripts); it < first_coupled; ++it) {
    auto source_subscript = std::get<0>(*(*it).begin());
    auto destination_subscript = std::get<1>(*(*it).begin());

    SENode* source_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(source_subscript));
    SENode* destination_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(destination_subscript));

    // Check the loops are in a form we support.
    auto subscript_pair = std::make_pair(source_node, destination_node);

    const Loop* loop = GetLoopForSubscriptPair(subscript_pair);
    if (loop) {
      if (!IsSupportedLoop(loop)) {
        PrintDebug(
            "GetDependence found an unsupported loop form. Assuming <=> for "
            "loop.");
        DistanceEntry* distance_entry =
            GetDistanceEntryForSubscriptPair(subscript_pair, distance_vector);
        if (distance_entry) {
          distance_entry->direction = DistanceEntry::Directions::ALL;
        }
        continue;
      }
    }

    // If either node is simplified to a CanNotCompute we can't perform any
    // analysis so must assume <=> dependence and return.
    if (source_node->GetType() == SENode::CanNotCompute ||
        destination_node->GetType() == SENode::CanNotCompute) {
      // Record the <=> dependence if we can get a DistanceEntry
      PrintDebug(
          "GetDependence found source_node || destination_node as "
          "CanNotCompute. Abandoning evaluation for this subscript.");
      DistanceEntry* distance_entry =
          GetDistanceEntryForSubscriptPair(subscript_pair, distance_vector);
      if (distance_entry) {
        distance_entry->direction = DistanceEntry::Directions::ALL;
      }
      continue;
    }

    // We have no induction variables so can apply a ZIV test.
    if (IsZIV(subscript_pair)) {
      PrintDebug("Found a ZIV subscript pair");
      if (ZIVTest(subscript_pair)) {
        PrintDebug("Proved independence with ZIVTest.");
        return true;
      }
    }

    // We have only one induction variable so should attempt an SIV test.
    if (IsSIV(subscript_pair)) {
      PrintDebug("Found a SIV subscript pair.");
      if (SIVTest(subscript_pair, distance_vector)) {
        PrintDebug("Proved independence with SIVTest.");
        return true;
      }
    }

    // We have multiple induction variables so should attempt an MIV test.
    if (IsMIV(subscript_pair)) {
      PrintDebug("Found a MIV subscript pair.");
      if (GCDMIVTest(subscript_pair)) {
        PrintDebug("Proved independence with the GCD test.");
        auto current_loops = CollectLoops(source_node, destination_node);

        for (auto current_loop : current_loops) {
          auto distance_entry =
              GetDistanceEntryForLoop(current_loop, distance_vector);
          distance_entry->direction = DistanceEntry::Directions::NONE;
        }
        return true;
      }
    }
  }

  for (auto it = first_coupled; it < std::end(sets_of_subscripts); ++it) {
    auto coupled_instructions = *it;
    std::vector<SubscriptPair> coupled_subscripts{};

    for (const auto& elem : coupled_instructions) {
      auto source_subscript = std::get<0>(elem);
      auto destination_subscript = std::get<1>(elem);

      SENode* source_node = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.AnalyzeInstruction(source_subscript));
      SENode* destination_node = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.AnalyzeInstruction(destination_subscript));

      coupled_subscripts.push_back({source_node, destination_node});
    }

    auto supported = true;

    for (const auto& subscript : coupled_subscripts) {
      auto loops = CollectLoops(std::get<0>(subscript), std::get<1>(subscript));

      auto is_subscript_supported =
          std::all_of(std::begin(loops), std::end(loops),
                      [this](const Loop* l) { return IsSupportedLoop(l); });

      supported = supported && is_subscript_supported;
    }

    if (DeltaTest(coupled_subscripts, distance_vector)) {
      return true;
    }
  }

  // We were unable to prove independence so must gather all of the direction
  // information we found.
  PrintDebug(
      "Couldn't prove independence.\n"
      "All possible direction information has been collected in the input "
      "DistanceVector.");

  return false;
}